

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optpfor.h
# Opt level: O2

void __thiscall
FastPForLib::OPTPFor<4U,_FastPForLib::Simple16<false>_>::~OPTPFor
          (OPTPFor<4U,_FastPForLib::Simple16<false>_> *this)

{
  NewPFor<4U,_FastPForLib::Simple16<false>_>::~NewPFor
            (&this->super_NewPFor<4U,_FastPForLib::Simple16<false>_>);
  operator_delete(this);
  return;
}

Assistant:

OPTPFor() {}